

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  size_t sVar1;
  ZSTD_CDict *cdict;
  long lVar2;
  ZSTD_paramSwitch_e useRowMatchFinder;
  ZSTD_cwksp *pZVar3;
  ZSTD_cwksp *pZVar4;
  undefined8 *puVar5;
  long lVar6;
  byte bVar7;
  ZSTD_CCtx_params in_stack_fffffffffffffe08;
  ZSTD_cwksp local_100 [2];
  ZSTD_paramSwitch_e local_70;
  
  bVar7 = 0;
  useRowMatchFinder = ZSTD_ps_disable;
  if (0xfffffffc < cParams.strategy - ZSTD_btlazy2) {
    useRowMatchFinder = (cParams.windowLog < 0xf) + ZSTD_ps_enable;
  }
  sVar1 = ZSTD_sizeof_matchState(&cParams,useRowMatchFinder,1,0);
  lVar6 = (dictSize + 7 & 0xfffffffffffffff8) + 0x39c0;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    lVar6 = 0x39c0;
  }
  if (((ulong)workspace & 7) == 0) {
    ZSTD_cwksp_init(local_100,workspace,workspaceSize,ZSTD_cwksp_static_alloc);
    cdict = (ZSTD_CDict *)ZSTD_cwksp_reserve_object(local_100,0x17c0);
    if (cdict != (ZSTD_CDict *)0x0) {
      pZVar3 = local_100;
      pZVar4 = &cdict->workspace;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        pZVar4->workspace = pZVar3->workspace;
        pZVar3 = (ZSTD_cwksp *)((long)pZVar3 + ((ulong)bVar7 * -2 + 1) * 8);
        pZVar4 = (ZSTD_cwksp *)((long)pZVar4 + (ulong)bVar7 * -0x10 + 8);
      }
      if (sVar1 + lVar6 <= workspaceSize) {
        memset(local_100,0,0xd0);
        local_100[0].tableValidEnd._0_4_ = 1;
        local_100[0].workspaceEnd._0_4_ = cParams.chainLog;
        local_100[0].workspace._4_4_ = cParams.windowLog;
        local_100[0].workspaceEnd._4_4_ = cParams.hashLog;
        local_100[0].objectEnd._0_4_ = cParams.searchLog;
        local_100[0].objectEnd._4_4_ = cParams.minMatch;
        local_100[0].tableEnd = (void *)CONCAT44(cParams.strategy,cParams.targetLength);
        local_70 = useRowMatchFinder;
        cdict->useRowMatchFinder = useRowMatchFinder;
        cdict->compressionLevel = 0;
        pZVar3 = local_100;
        puVar5 = (undefined8 *)&stack0xfffffffffffffe08;
        for (lVar6 = 0x1a; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar5 = pZVar3->workspace;
          pZVar3 = (ZSTD_cwksp *)((long)pZVar3 + ((ulong)bVar7 * -2 + 1) * 8);
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        }
        sVar1 = ZSTD_initCDict_internal
                          (cdict,dict,dictSize,dictLoadMethod,dictContentType,
                           in_stack_fffffffffffffe08);
        if (sVar1 < 0xffffffffffffff89) {
          return cdict;
        }
        return (ZSTD_CDict *)0x0;
      }
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    ZSTD_paramSwitch_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(ZSTD_ps_auto, &cParams);
    /* enableDedicatedDictSearch == 1 ensures matchstate is not too small in case this CDict will be used for DDS + row hash */
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 1, /* forCCtx */ 0);
    size_t const neededSize = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
                            + (dictLoadMethod == ZSTD_dlm_byRef ? 0
                               : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))))
                            + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
                            + matchStateSize;
    ZSTD_CDict* cdict;
    ZSTD_CCtx_params params;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */

    {
        ZSTD_cwksp ws;
        ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);
        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        if (cdict == NULL) return NULL;
        ZSTD_cwksp_move(&cdict->workspace, &ws);
    }

    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    ZSTD_CCtxParams_init(&params, 0);
    params.cParams = cParams;
    params.useRowMatchFinder = useRowMatchFinder;
    cdict->useRowMatchFinder = useRowMatchFinder;
    cdict->compressionLevel = ZSTD_NO_CLEVEL;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              dictLoadMethod, dictContentType,
                                              params) ))
        return NULL;

    return cdict;
}